

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

LY_ERR lyb_parse_siblings(lyd_lyb_ctx *lybctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  ushort uVar1;
  lyd_lyb_sibling *plVar2;
  ly_ctx *plVar3;
  LY_VALUE_FORMAT LVar4;
  uint32_t flags;
  lyd_meta *__s;
  lyd_ctx *plVar5;
  char *module_key_00;
  char *value_00;
  LY_ERR ret__;
  LY_ERR LVar6;
  LY_ERR LVar7;
  lysc_node *plVar8;
  size_t name_len;
  size_t sVar9;
  size_t sVar10;
  byte bVar11;
  long lVar12;
  lys_module *mod_00;
  lylyb_ctx *plVar13;
  char *pcVar14;
  char *pcVar15;
  lyd_node *__s_00;
  LY_ERR LVar16;
  LYD_ANYDATA_VALUETYPE value_type;
  ly_bool dynamic_1;
  char *name;
  ly_bool dynamic;
  uint8_t count;
  lyd_meta *meta;
  lyd_node **local_118;
  lyd_node *tree;
  char *value;
  ly_set *local_100;
  lyd_node *local_f8;
  lyd_meta *meta_1;
  lyd_meta *local_e8;
  lyd_node *node_3;
  lyd_ctx *lydctx;
  size_t local_d0;
  void *local_c8;
  undefined4 local_bc;
  lyd_ctx *local_b8;
  lyd_meta *local_b0;
  size_t local_a8;
  lysc_node *snode;
  size_t local_98;
  char *mod_name;
  void *val_prefix_data;
  char *module_key;
  char *prefix;
  char *name_1;
  char *value_1;
  ly_ctx *local_60;
  lylyb_ctx *local_58;
  lyd_ctx *local_50;
  lys_module *mod;
  char local_3b [11];
  
  plVar2 = lybctx->lybctx->siblings;
  if (plVar2 == (lyd_lyb_sibling *)0x0) {
    local_bc = 0;
  }
  else {
    local_bc = (undefined4)
               CONCAT71((int7)((ulong)plVar2 >> 8),*(long *)&plVar2[-1].inner_chunks != 0);
  }
  local_f8 = parent;
  LVar6 = lyb_read_start_siblings(lybctx->lybctx);
  LVar7 = LY_EMEM;
  local_118 = first_p;
  local_100 = parsed;
  local_b8 = (lyd_ctx *)lybctx;
  if (LVar6 == LY_SUCCESS) {
    do {
      plVar13 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
      plVar2 = plVar13->siblings;
      if (plVar2 == (lyd_lyb_sibling *)0x0) {
        lVar12 = -1;
      }
      else {
        lVar12 = *(long *)&plVar2[-1].inner_chunks + -1;
      }
      if (plVar2[lVar12].written == 0) goto LAB_00138eff;
      mod_name = (char *)0x0;
      name = (char *)0x0;
      lyb_read((uint8_t *)&name,1,plVar13);
      if ((LYD_ANYDATA_VALUETYPE)name - 1 < 2) {
        plVar8 = lyd_parser_node_schema(local_f8);
        mod_00 = (lys_module *)0x0;
LAB_00138154:
        LVar6 = lyb_parse_schema_hash(lybctx,plVar8,mod_00,&snode);
        if (LVar6 != LY_SUCCESS) {
LAB_00138ef0:
          pcVar15 = (char *)0x0;
          goto LAB_00138ed3;
        }
        pcVar15 = (char *)0x0;
      }
      else {
        if ((LYD_ANYDATA_VALUETYPE)name == 3) {
          LVar6 = lyb_read_model((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx,&mod_name,local_3b,
                                 (ly_set *)0x0);
          pcVar15 = mod_name;
          if (LVar6 != LY_SUCCESS) goto LAB_00138ed3;
          name = (char *)0x0;
          if (local_f8 == (lyd_node *)0x0) {
            __assert_fail("parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                          ,0x366,
                          "LY_ERR lyb_parse_schema_nested_ext(struct lyd_lyb_ctx *, const struct lyd_node *, const char *, const struct lysc_node **)"
                         );
          }
          LVar6 = lyb_read_string(&name,'\x02',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
          if (LVar6 == LY_SUCCESS) {
            if (pcVar15 == (char *)0x0) {
              sVar9 = 0;
            }
            else {
              sVar9 = strlen(pcVar15);
            }
            pcVar14 = name;
            name_len = strlen(name);
            LVar6 = ly_nested_ext_schema
                              (local_f8,(lysc_node *)0x0,pcVar15,sVar9,LY_VALUE_JSON,(void *)0x0,
                               pcVar14,name_len,&snode,(lysc_ext_instance **)&meta);
            if (LVar6 == LY_SUCCESS) {
              lyb_cache_module_hash(snode->module);
              free(pcVar14);
              first_p = local_118;
              goto LAB_0013824d;
            }
            if (LVar6 == LY_ENOT) {
              LVar6 = LY_EINVAL;
              ly_log(((lyd_ctx *)lybctx)->data_ctx->ctx,LY_LLERR,LY_EINVAL,
                     "Failed to parse node \"%s\" as nested extension instance data.",pcVar14);
            }
          }
          else {
            LVar6 = LY_EMEM;
            pcVar14 = name;
          }
          free(pcVar14);
          goto LAB_00138ed3;
        }
        pcVar15 = (char *)0x0;
        if ((LYD_ANYDATA_VALUETYPE)name == 0) {
          LVar6 = lyb_parse_model((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx,
                                  ((lyd_ctx *)lybctx)->parse_opts,'\0',&mod);
          if (LVar6 == LY_SUCCESS) {
            plVar8 = (lysc_node *)0x0;
            mod_00 = mod;
            goto LAB_00138154;
          }
          goto LAB_00138ef0;
        }
      }
LAB_0013824d:
      plVar8 = snode;
      if (snode == (lysc_node *)0x0) {
        __s_00 = (lyd_node *)0x0;
        node_3 = (lyd_node *)0x0;
        local_e8 = (lyd_meta *)0x0;
        value_1 = (char *)0x0;
        name_1 = (char *)0x0;
        prefix = (char *)0x0;
        module_key = (char *)0x0;
        dynamic = '\0';
        val_prefix_data = (void *)0x0;
        plVar13 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
        local_60 = plVar13->ctx;
        meta = (lyd_meta *)0x0;
        tree = (lyd_node *)0x0;
        meta_1 = (lyd_meta *)0x0;
        lydctx = (lyd_ctx *)0x0;
        value = (char *)0x0;
        dynamic_1 = '\0';
        local_c8 = (void *)0x0;
        lyb_read(&count,1,plVar13);
        LVar6 = LY_SUCCESS;
        if (count != '\0') {
          local_b0 = (lyd_meta *)0x0;
          sVar10 = 0;
          local_58 = plVar13;
          do {
            plVar13 = local_58;
            local_98 = sVar10;
            LVar7 = lyb_read_string((char **)&tree,'\x02',local_58);
            LVar6 = LY_EMEM;
            __s_00 = tree;
            if (LVar7 != LY_SUCCESS) goto LAB_001388a5;
            if ((char)tree->hash == '\0') {
              free(tree);
              tree = (lyd_node *)0x0;
            }
            __s_00 = tree;
            LVar7 = lyb_read_string((char **)&meta_1,'\x02',plVar13);
            if (LVar7 != LY_SUCCESS) goto LAB_001388a5;
            if (*(char *)&meta_1->parent == '\0') {
              free(meta_1);
              meta_1 = (lyd_meta *)0x0;
            }
            __s = meta_1;
            LVar7 = lyb_read_string((char **)&lydctx,'\x02',plVar13);
            first_p = local_118;
            parsed = local_100;
            if (LVar7 != LY_SUCCESS) goto LAB_001388a5;
            name = (char *)0x0;
            lyb_read((uint8_t *)&name,1,plVar13);
            LVar4 = (LYD_ANYDATA_VALUETYPE)name;
            LVar6 = lyb_parse_prefix_data(plVar13,(LYD_ANYDATA_VALUETYPE)name,&local_c8);
            first_p = local_118;
            parsed = local_100;
            if (LVar6 != LY_SUCCESS) goto LAB_001388a5;
            LVar6 = lyb_read_string(&value,'\b',plVar13);
            plVar5 = lydctx;
            if (LVar6 != LY_SUCCESS) {
              local_e8 = local_b0;
              ly_free_prefix_data(LVar4,local_c8);
              LVar6 = LY_EMEM;
              first_p = local_118;
              parsed = local_100;
              goto LAB_001388b2;
            }
            dynamic_1 = '\x01';
            plVar3 = plVar13->ctx;
            sVar9 = strlen((char *)lydctx);
            if (__s_00 == (lyd_node *)0x0) {
              local_d0 = 0;
            }
            else {
              local_d0 = strlen((char *)__s_00);
            }
            local_50 = plVar5;
            local_a8 = sVar9;
            if (__s == (lyd_meta *)0x0) {
              sVar9 = 0;
            }
            else {
              sVar9 = strlen((char *)__s);
            }
            pcVar15 = value;
            if (value == (char *)0x0) {
              sVar10 = 0;
            }
            else {
              sVar10 = strlen(value);
            }
            plVar5 = local_50;
            LVar6 = lyd_create_attr((lyd_node *)0x0,(lyd_attr **)&meta,plVar3,(char *)local_50,
                                    local_a8,(char *)__s_00,local_d0,(char *)__s,sVar9,pcVar15,
                                    sVar10,&dynamic_1,LVar4,local_c8,0x3f3);
            first_p = local_118;
            lybctx = (lyd_lyb_ctx *)local_b8;
            plVar13 = local_58;
            parsed = local_100;
            if (LVar6 != LY_SUCCESS) goto LAB_001388a5;
            free(__s_00);
            tree = (lyd_node *)0x0;
            free(__s);
            meta_1 = (lyd_meta *)0x0;
            free(plVar5);
            lydctx = (lyd_ctx *)0x0;
            if (dynamic_1 != '\0') {
              __assert_fail("!dynamic",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                            ,0x2af,
                            "LY_ERR lyb_parse_attributes(struct lylyb_ctx *, struct lyd_attr **)");
            }
            value = (char *)0x0;
            if (local_b0 == (lyd_meta *)0x0) {
              local_b0 = meta;
            }
            bVar11 = (char)local_98 + 1;
            sVar10 = CONCAT71((int7)(local_98 >> 8),bVar11);
            first_p = local_118;
            lybctx = (lyd_lyb_ctx *)local_b8;
            parsed = local_100;
          } while (bVar11 < count);
          __s_00 = (lyd_node *)0x0;
          LVar6 = LY_SUCCESS;
          plVar13 = local_58;
LAB_001388a5:
          local_e8 = local_b0;
        }
LAB_001388b2:
        free(__s_00);
        free(meta_1);
        free(lydctx);
        if (dynamic_1 != '\0') {
          free(value);
        }
        if (LVar6 == LY_SUCCESS) {
          name = (char *)0x0;
          lyb_read((uint8_t *)&name,4,(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
          flags = (LYD_ANYDATA_VALUETYPE)name;
          LVar7 = lyb_read_string(&prefix,'\x02',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
          LVar16 = LY_EMEM;
          LVar6 = LVar16;
          if (((LVar7 == LY_SUCCESS) &&
              (LVar7 = lyb_read_string(&module_key,'\x02',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx
                                      ), LVar7 == LY_SUCCESS)) &&
             (LVar7 = lyb_read_string(&name_1,'\x02',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx),
             LVar7 == LY_SUCCESS)) {
            LVar7 = lyb_read_string(&value_1,'\b',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
            if (LVar7 == LY_SUCCESS) {
              dynamic = '\x01';
              name = (char *)0x0;
              lyb_read((uint8_t *)&name,1,(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
              LVar4 = (LYD_ANYDATA_VALUETYPE)name;
              LVar6 = lyb_parse_prefix_data
                                ((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx,
                                 (LYD_ANYDATA_VALUETYPE)name,&val_prefix_data);
              pcVar15 = name_1;
              first_p = local_118;
              if (LVar6 == LY_SUCCESS) {
                if (((ulong)*(anon_union_8_2_ef77c6a4_for_lyd_lyb_ctx_1 *)
                             &((lyd_ctx *)lybctx)->parse_opts & 0x40000) == 0) {
                  LVar7 = lyb_read_start_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                  first_p = local_118;
                  LVar6 = LVar16;
                  if (LVar7 == LY_SUCCESS) {
                    lyb_skip_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                    LVar6 = lyb_read_stop_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                  }
                }
                else {
                  local_98 = strlen(name_1);
                  pcVar14 = prefix;
                  if (prefix == (char *)0x0) {
                    local_d0 = 0;
                  }
                  else {
                    local_d0 = strlen(prefix);
                  }
                  module_key_00 = module_key;
                  if (module_key == (char *)0x0) {
                    local_a8 = 0;
                  }
                  else {
                    local_a8 = strlen(module_key);
                  }
                  value_00 = value_1;
                  sVar9 = strlen(value_1);
                  LVar6 = lyd_create_opaq(local_60,pcVar15,local_98,pcVar14,local_d0,module_key_00,
                                          local_a8,value_00,sVar9,&dynamic,LVar4,val_prefix_data,
                                          0x3f3,&node_3);
                  lybctx = (lyd_lyb_ctx *)local_b8;
                  first_p = local_118;
                  parsed = local_100;
                  if (LVar6 == LY_SUCCESS) {
                    if (node_3 == (lyd_node *)0x0) {
                      __assert_fail("node",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                    ,0x48f,
                                    "LY_ERR lyb_parse_node_opaq(struct lyd_lyb_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                                   );
                    }
                    ly_log_location((lysc_node *)0x0,node_3,(char *)0x0,(ly_in *)0x0);
                    LVar6 = lyb_parse_siblings(lybctx,node_3,(lyd_node **)0x0,(ly_set *)0x0);
                    parsed = local_100;
                    first_p = local_118;
                    if (LVar6 == LY_SUCCESS) {
                      lyb_finish_opaq(lybctx,local_f8,flags,(lyd_attr **)&local_e8,&node_3,local_118
                                      ,local_100);
                      if (node_3 != (lyd_node *)0x0 || local_e8 != (lyd_meta *)0x0) {
                        __assert_fail("!attr && !node",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                      ,0x498,
                                      "LY_ERR lyb_parse_node_opaq(struct lyd_lyb_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                                     );
                      }
                      LVar6 = LY_SUCCESS;
                      ly_log_location_revert(0,1,0,0);
                    }
                  }
                }
              }
            }
            else {
              ly_free_prefix_data(LY_VALUE_CANON,val_prefix_data);
            }
          }
        }
        else {
          lyd_free_attr_siblings(plVar13->ctx,(lyd_attr *)local_e8);
          local_e8 = (lyd_meta *)0x0;
        }
        if (node_3 != (lyd_node *)0x0) {
          ly_log_location_revert(0,1,0,0);
        }
        free(prefix);
        free(module_key);
        free(name_1);
        if (dynamic != '\0') {
          free(value_1);
        }
        lyd_free_attr_siblings(local_60,(lyd_attr *)local_e8);
        lyd_free_tree(node_3);
        pcVar15 = mod_name;
      }
      else {
        uVar1 = snode->nodetype;
        if ((uVar1 & 8) == 0) {
          if (uVar1 == 0x10) {
            name = (char *)0x0;
            meta = (lyd_meta *)0x0;
            LVar7 = lyb_read_start_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
            LVar6 = LY_EMEM;
            if (LVar7 == LY_SUCCESS) {
              while( true ) {
                plVar13 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
                plVar2 = plVar13->siblings;
                if (plVar2 == (lyd_lyb_sibling *)0x0) {
                  lVar12 = -1;
                }
                else {
                  lVar12 = *(long *)&plVar2[-1].inner_chunks + -1;
                }
                if (plVar2[lVar12].written == 0) goto LAB_001386ec;
                LVar6 = lyb_parse_node_header(lybctx,plVar8,(uint32_t *)&tree,&meta);
                if ((LVar6 != LY_SUCCESS) ||
                   (LVar6 = lyd_create_inner(plVar8,(lyd_node **)&name), LVar6 != LY_SUCCESS))
                goto LAB_001389c8;
                if (name == (char *)0x0) {
                  __assert_fail("node",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                ,0x5a9,
                                "LY_ERR lyb_parse_node_list(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                               );
                }
                ly_log_location((lysc_node *)0x0,(lyd_node *)name,(char *)0x0,(ly_in *)0x0);
                LVar6 = lyb_parse_siblings(lybctx,(lyd_node *)name,(lyd_node **)0x0,(ly_set *)0x0);
                if ((LVar6 != LY_SUCCESS) ||
                   (((((lyd_ctx *)lybctx)->parse_opts & 0x10000) == 0 &&
                    (LVar6 = lyd_parser_validate_new_implicit((lyd_ctx *)lybctx,(lyd_node *)name),
                    LVar6 != LY_SUCCESS)))) break;
                if ((plVar8->nodetype & 0x700) != 0) {
                  ((lyd_ctx *)lybctx)->op_node = (lyd_node *)name;
                }
                lyb_finish_node(lybctx,local_f8,(uint32_t)tree,&meta,(lyd_node **)&name,first_p,
                                parsed);
                ly_log_location_revert(0,1,0,0);
              }
LAB_001387ca:
              ly_log_location_revert(0,1,0,0);
LAB_001389c8:
              lyd_free_meta_siblings(meta);
              lyd_free_tree((lyd_node *)name);
            }
          }
          else if ((uVar1 & 0x60) == 0) {
            if ((uVar1 & 0x711) != 0) {
              name = (char *)0x0;
              meta = (lyd_meta *)0x0;
              LVar6 = lyb_parse_node_header(lybctx,snode,(uint32_t *)&tree,&meta);
              if ((LVar6 == LY_SUCCESS) &&
                 (LVar6 = lyd_create_inner(plVar8,(lyd_node **)&name), LVar6 == LY_SUCCESS)) {
                if (name == (char *)0x0) {
                  __assert_fail("node",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                ,0x51f,
                                "LY_ERR lyb_parse_node_inner(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                               );
                }
                ly_log_location((lysc_node *)0x0,(lyd_node *)name,(char *)0x0,(ly_in *)0x0);
                LVar6 = lyb_parse_siblings(lybctx,(lyd_node *)name,(lyd_node **)0x0,(ly_set *)0x0);
                if ((LVar6 == LY_SUCCESS) &&
                   (((((lyd_ctx *)lybctx)->parse_opts & 0x10000) != 0 ||
                    (LVar6 = lyd_parser_validate_new_implicit((lyd_ctx *)lybctx,(lyd_node *)name),
                    LVar6 == LY_SUCCESS)))) {
                  if ((plVar8->nodetype & 0x700) != 0) {
                    ((lyd_ctx *)lybctx)->op_node = (lyd_node *)name;
                  }
                  lyb_finish_node(lybctx,local_f8,(uint32_t)tree,&meta,(lyd_node **)&name,first_p,
                                  parsed);
                  LVar6 = LY_SUCCESS;
                  ly_log_location_revert(0,1,0,0);
                  goto LAB_00138bb3;
                }
              }
              if (name != (char *)0x0) goto LAB_001387ca;
              goto LAB_001389c8;
            }
            LVar6 = lyb_parse_node_leaf(lybctx,local_f8,snode,first_p,parsed);
          }
          else {
            meta = (lyd_meta *)0x0;
            tree = (lyd_node *)0x0;
            meta_1 = (lyd_meta *)0x0;
            lydctx = (lyd_ctx *)0x0;
            value = (char *)0x0;
            plVar3 = ((lyd_ctx *)lybctx)->data_ctx->ctx;
            LVar6 = lyb_parse_node_header(lybctx,snode,(uint32_t *)&local_c8,&meta_1);
            if (LVar6 == LY_SUCCESS) {
              name = (char *)0x0;
              lyb_read((uint8_t *)&name,4,(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
              value_type = (LYD_ANYDATA_VALUETYPE)name;
              if (((LYD_ANYDATA_VALUETYPE)name == LYD_ANYDATA_DATATREE) ||
                 (((LYD_ANYDATA_VALUETYPE)name != LYD_ANYDATA_LYB && (plVar8->nodetype == 0x60)))) {
LAB_00138842:
                LVar6 = LY_EINT;
                ly_log(plVar3,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                      );
              }
              else {
                LVar7 = lyb_read_string(&value,'\b',(lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
                pcVar14 = value;
                LVar6 = LY_EMEM;
                if (LVar7 == LY_SUCCESS) {
                  if (value_type == LYD_ANYDATA_LYB) {
                    LVar6 = ly_in_new_memory(value,(ly_in **)&name);
                    first_p = local_118;
                    parsed = local_100;
                    if (LVar6 != LY_SUCCESS) goto LAB_00138bb3;
                    LVar6 = lyd_parse_lyb(plVar3,(lysc_ext_instance *)0x0,(lyd_node *)0x0,&tree,
                                          (ly_in *)name,0x70000,0,0x30,(ly_set *)0x0,(ly_bool *)0x0,
                                          &lydctx);
                    ly_in_free((ly_in *)name,'\0');
                    if (lydctx != (lyd_ctx *)0x0) {
                      (*lydctx->free)(lydctx);
                    }
                    if (LVar6 == LY_SUCCESS) {
                      free(pcVar14);
                      value = (char *)tree;
                      value_type = LYD_ANYDATA_DATATREE;
                      goto LAB_00138d17;
                    }
                    lyd_free_siblings(tree);
                  }
                  else {
                    if (LYD_ANYDATA_JSON < value_type) goto LAB_00138842;
LAB_00138d17:
                    LVar6 = lyd_create_any(plVar8,value,value_type,'\x01',(lyd_node **)&meta);
                    if (LVar6 == LY_SUCCESS) {
                      if (meta == (lyd_meta *)0x0) {
                        __assert_fail("node",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                      ,0x4f4,
                                      "LY_ERR lyb_parse_node_any(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                                     );
                      }
                      LVar6 = LY_SUCCESS;
                      ly_log_location((lysc_node *)0x0,(lyd_node *)meta,(char *)0x0,(ly_in *)0x0);
                      lyb_finish_node(lybctx,local_f8,(uint32_t)local_c8,&meta_1,(lyd_node **)&meta,
                                      local_118,local_100);
                      ly_log_location_revert(0,1,0,0);
                      first_p = local_118;
                      parsed = local_100;
                      goto LAB_00138bb3;
                    }
                  }
                }
              }
            }
            free(value);
            lyd_free_meta_siblings(meta_1);
            lyd_free_tree((lyd_node *)meta);
            first_p = local_118;
            parsed = local_100;
          }
        }
        else {
          LVar6 = lyb_read_start_siblings((lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx);
          if (LVar6 != LY_SUCCESS) {
            LVar6 = LY_EMEM;
LAB_00138ed3:
            free(pcVar15);
            return LVar6;
          }
          while( true ) {
            plVar13 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
            plVar2 = plVar13->siblings;
            if (plVar2 == (lyd_lyb_sibling *)0x0) {
              lVar12 = -1;
            }
            else {
              lVar12 = *(long *)&plVar2[-1].inner_chunks + -1;
            }
            if (plVar2[lVar12].written == 0) break;
            LVar6 = lyb_parse_node_leaf(lybctx,local_f8,plVar8,first_p,parsed);
            if (LVar6 != LY_SUCCESS) goto LAB_00138ed3;
          }
LAB_001386ec:
          LVar6 = lyb_read_stop_siblings(plVar13);
        }
      }
LAB_00138bb3:
      free(pcVar15);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
    } while (((char)local_bc != '\0') || ((((lyd_ctx *)lybctx)->int_opts & 0x20) != 0));
    plVar13 = (lylyb_ctx *)((lyd_ctx *)lybctx)->data_ctx;
LAB_00138eff:
    LVar7 = lyb_read_stop_siblings(plVar13);
  }
  return LVar7;
}

Assistant:

static LY_ERR
lyb_parse_siblings(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, struct lyd_node **first_p,
        struct ly_set *parsed)
{
    ly_bool top_level;

    top_level = !LY_ARRAY_COUNT(lybctx->lybctx->siblings);

    /* register a new siblings */
    LY_CHECK_RET(lyb_read_start_siblings(lybctx->lybctx));

    while (LYB_LAST_SIBLING(lybctx->lybctx).written) {
        LY_CHECK_RET(lyb_parse_node(lybctx, parent, first_p, parsed));

        if (top_level && !(lybctx->int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    }

    /* end the siblings */
    LY_CHECK_RET(lyb_read_stop_siblings(lybctx->lybctx));

    return LY_SUCCESS;
}